

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntlm.c
# Opt level: O2

CURLcode Curl_auth_create_ntlm_type3_message
                   (Curl_easy *data,char *userp,char *passwdp,ntlmdata *ntlm,char **outptr,
                   size_t *outlen)

{
  ulong uVar1;
  Curl_easy *pCVar2;
  int iVar3;
  CURLcode CVar4;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  char *__s;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong domlen;
  uint ntresplen;
  ulong local_950;
  ulong local_948;
  Curl_easy *local_940;
  ntlmdata *local_938;
  size_t local_930;
  uchar *local_928;
  char *local_920;
  uchar *ntlmv2resp;
  uint local_90c;
  uint entropy [2];
  uchar ntresp [24];
  uchar lmresp [24];
  uint entropy_1 [2];
  uchar md5sum [16];
  uchar ntlmbuf [1024];
  char host [1025];
  
  ntresplen = 0x18;
  ntlmv2resp = (uchar *)0x0;
  local_948 = (ulong)ntlm->flags;
  local_940 = data;
  memset(host,0,0x401);
  pcVar6 = strchr(userp,0x5c);
  if (pcVar6 == (char *)0x0) {
    pcVar6 = strchr(userp,0x2f);
  }
  domlen = (long)pcVar6 - (long)userp;
  __s = pcVar6 + 1;
  if (pcVar6 == (char *)0x0) {
    __s = userp;
  }
  local_920 = userp;
  if (pcVar6 == (char *)0x0) {
    domlen = 0;
    local_920 = "";
  }
  if (__s == (char *)0x0) {
    local_950 = 0;
  }
  else {
    local_950 = strlen(__s);
  }
  pCVar2 = local_940;
  iVar3 = Curl_gethostname(host,0x401);
  if (iVar3 == 0) {
    local_930 = strlen(host);
  }
  else {
    local_930 = 0;
    Curl_infof(pCVar2,"gethostname() failed, continuing without!\n");
  }
  if (ntlm->target_info_len == 0) {
    if ((ntlm->flags & 0x80000) == 0) {
      CVar4 = Curl_ntlm_core_mk_nt_hash(pCVar2,passwdp,ntlmbuf);
      if (CVar4 != CURLE_OK) {
        return CVar4;
      }
      local_938 = ntlm;
      Curl_ntlm_core_lm_resp(ntlmbuf,ntlm->nonce,ntresp);
      CVar4 = Curl_ntlm_core_mk_lm_hash(pCVar2,passwdp,(uchar *)entropy);
      if (CVar4 != CURLE_OK) {
        return CVar4;
      }
      local_928 = ntresp;
      Curl_ntlm_core_lm_resp((uchar *)entropy,ntlm->nonce,lmresp);
      uVar5 = 0x18;
      uVar7 = (uint)local_948;
      ntlm = local_938;
      uVar13 = local_950;
      goto LAB_0013b86b;
    }
    CVar4 = Curl_rand(pCVar2,entropy_1,2);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    lmresp._0_8_ = entropy_1;
    lmresp[8] = '\0';
    lmresp[9] = '\0';
    lmresp[10] = '\0';
    lmresp[0xb] = '\0';
    lmresp[0xc] = '\0';
    lmresp[0xd] = '\0';
    lmresp[0xe] = '\0';
    lmresp[0xf] = '\0';
    lmresp[0x10] = '\0';
    lmresp[0x11] = '\0';
    lmresp[0x12] = '\0';
    lmresp[0x13] = '\0';
    lmresp[0x14] = '\0';
    lmresp[0x15] = '\0';
    lmresp[0x16] = '\0';
    lmresp[0x17] = '\0';
    entropy = *(uint (*) [2])ntlm->nonce;
    CVar4 = Curl_ssl_md5sum((uchar *)entropy,0x10,md5sum,0x10);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    CVar4 = Curl_ntlm_core_mk_nt_hash(local_940,passwdp,ntlmbuf);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    local_928 = ntresp;
    Curl_ntlm_core_lm_resp(ntlmbuf,md5sum,local_928);
    uVar5 = 0x18;
    uVar13 = local_950;
  }
  else {
    CVar4 = Curl_rand(pCVar2,entropy,2);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    CVar4 = Curl_ntlm_core_mk_nt_hash(pCVar2,passwdp,ntlmbuf);
    uVar13 = local_950;
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    CVar4 = Curl_ntlm_core_mk_ntlmv2_hash(__s,local_950,local_920,domlen,ntlmbuf,ntresp);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    CVar4 = Curl_ntlm_core_mk_lmv2_resp(ntresp,(uchar *)entropy,ntlm->nonce,lmresp);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    CVar4 = Curl_ntlm_core_mk_ntlmv2_resp(ntresp,(uchar *)entropy,ntlm,&ntlmv2resp,&ntresplen);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    local_928 = ntlmv2resp;
    uVar5 = ntresplen;
  }
  uVar7 = (uint)local_948;
LAB_0013b86b:
  uVar7 = uVar7 & 1;
  local_948 = (ulong)uVar7;
  local_938 = (ntlmdata *)(local_930 << (sbyte)uVar7);
  uVar8 = domlen * 2;
  uVar1 = uVar13 * 2;
  if (uVar7 == 0) {
    uVar8 = domlen;
    uVar1 = uVar13;
  }
  uVar7 = uVar5 + 0x58;
  uVar14 = uVar8 + uVar7;
  local_90c = uVar5 & 0xff;
  uVar10 = uVar5 >> 8 & 0xff;
  uVar9 = (ulong)((uint)(uVar8 >> 8) & 0xff);
  uVar11 = (ulong)((uint)(uVar1 >> 8) & 0xff);
  uVar12 = (ulong)((uint)((ulong)local_938 >> 8) & 0xff);
  uVar5 = ntlm->flags;
  uVar5 = curl_msnprintf((char *)ntlmbuf,0x400,
                         "NTLMSSP%c\x03%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c"
                         ,0,0,0,0,0x18,0,0x18,0,0x40,0,0,0,local_90c,uVar10,local_90c,uVar10,0x58,0,
                         0,0,uVar8 & 0xff,uVar9,uVar8 & 0xff,uVar9,(ulong)uVar7 & 0xff,
                         (ulong)(uVar7 >> 8 & 0xff),0,0,uVar1 & 0xff,uVar11,uVar1 & 0xff,uVar11,
                         uVar14 & 0xff,(ulong)((uint)(uVar14 >> 8) & 0xff),0,0,
                         (ulong)local_938 & 0xff,uVar12,(ulong)local_938 & 0xff,uVar12,
                         uVar1 + uVar14 & 0xff,(ulong)((uint)(uVar1 + uVar14 >> 8) & 0xff),0,0,0,0,0
                         ,0,0,0,0,0,uVar5 & 0xff,uVar5 >> 8 & 0xff,uVar5 >> 0x10 & 0xff,
                         uVar5 >> 0x18);
  uVar14 = (ulong)(int)uVar5;
  if (uVar5 < 1000) {
    *(undefined8 *)(ntlmbuf + uVar14 + 0x10) = lmresp._16_8_;
    *(undefined8 *)(ntlmbuf + uVar14) = lmresp._0_8_;
    *(undefined8 *)(ntlmbuf + uVar14 + 8) = lmresp._8_8_;
    uVar14 = uVar14 + 0x18;
  }
  uVar9 = (ulong)ntresplen;
  if (uVar14 < 0x400 - ntresplen) {
    memcpy(ntlmbuf + uVar14,local_928,uVar9);
    uVar14 = uVar14 + uVar9;
  }
  pCVar2 = local_940;
  (*Curl_cfree)(ntlmv2resp);
  if (uVar1 + uVar8 + (long)local_938 + uVar14 < 0x400) {
    if ((int)local_948 == 0) {
      memcpy(ntlmbuf + uVar14,local_920,domlen);
      uVar13 = local_950;
      memcpy(ntlmbuf + uVar14 + domlen,__s,local_950);
      lVar15 = uVar14 + domlen + uVar13;
      memcpy(ntlmbuf + lVar15,host,local_930);
    }
    else {
      unicodecpy(ntlmbuf + uVar14,local_920,domlen & 0x7fffffffffffffff);
      lVar15 = uVar14 + domlen * 2;
      unicodecpy(ntlmbuf + lVar15,__s,local_950 & 0x7fffffffffffffff);
      lVar15 = lVar15 + uVar13 * 2;
      unicodecpy(ntlmbuf + lVar15,host,local_930 & 0x7fffffffffffffff);
    }
    CVar4 = Curl_base64_encode((Curl_easy *)0x0,(char *)ntlmbuf,lVar15 + (long)local_938,outptr,
                               outlen);
    (*Curl_cfree)(ntlm->target_info);
    ntlm->target_info = (void *)0x0;
    ntlm->target_info_len = 0;
  }
  else {
    Curl_failf(pCVar2,"user + domain + host name too big");
    CVar4 = CURLE_OUT_OF_MEMORY;
  }
  return CVar4;
}

Assistant:

CURLcode Curl_auth_create_ntlm_type3_message(struct Curl_easy *data,
                                             const char *userp,
                                             const char *passwdp,
                                             struct ntlmdata *ntlm,
                                             char **outptr, size_t *outlen)

{
  /* NTLM type-3 message structure:

          Index  Description            Content
            0    NTLMSSP Signature      Null-terminated ASCII "NTLMSSP"
                                        (0x4e544c4d53535000)
            8    NTLM Message Type      long (0x03000000)
           12    LM/LMv2 Response       security buffer
           20    NTLM/NTLMv2 Response   security buffer
           28    Target Name            security buffer
           36    User Name              security buffer
           44    Workstation Name       security buffer
          (52)   Session Key            security buffer (*)
          (60)   Flags                  long (*)
          (64)   OS Version Structure   8 bytes (*)
  52 (64) (72)   Start of data block
                                          (*) -> Optional
  */

  CURLcode result = CURLE_OK;
  size_t size;
  unsigned char ntlmbuf[NTLM_BUFSIZE];
  int lmrespoff;
  unsigned char lmresp[24]; /* fixed-size */
#if USE_NTRESPONSES
  int ntrespoff;
  unsigned int ntresplen = 24;
  unsigned char ntresp[24]; /* fixed-size */
  unsigned char *ptr_ntresp = &ntresp[0];
  unsigned char *ntlmv2resp = NULL;
#endif
  bool unicode = (ntlm->flags & NTLMFLAG_NEGOTIATE_UNICODE) ? TRUE : FALSE;
  char host[HOSTNAME_MAX + 1] = "";
  const char *user;
  const char *domain = "";
  size_t hostoff = 0;
  size_t useroff = 0;
  size_t domoff = 0;
  size_t hostlen = 0;
  size_t userlen = 0;
  size_t domlen = 0;

  user = strchr(userp, '\\');
  if(!user)
    user = strchr(userp, '/');

  if(user) {
    domain = userp;
    domlen = (user - domain);
    user++;
  }
  else
    user = userp;

  if(user)
    userlen = strlen(user);

  /* Get the machine's un-qualified host name as NTLM doesn't like the fully
     qualified domain name */
  if(Curl_gethostname(host, sizeof(host))) {
    infof(data, "gethostname() failed, continuing without!\n");
    hostlen = 0;
  }
  else {
    hostlen = strlen(host);
  }

#if USE_NTRESPONSES && USE_NTLM_V2
  if(ntlm->target_info_len) {
    unsigned char ntbuffer[0x18];
    unsigned int entropy[2];
    unsigned char ntlmv2hash[0x18];

    result = Curl_rand(data, &entropy[0], 2);
    if(result)
      return result;

    result = Curl_ntlm_core_mk_nt_hash(data, passwdp, ntbuffer);
    if(result)
      return result;

    result = Curl_ntlm_core_mk_ntlmv2_hash(user, userlen, domain, domlen,
                                           ntbuffer, ntlmv2hash);
    if(result)
      return result;

    /* LMv2 response */
    result = Curl_ntlm_core_mk_lmv2_resp(ntlmv2hash,
                                         (unsigned char *)&entropy[0],
                                         &ntlm->nonce[0], lmresp);
    if(result)
      return result;

    /* NTLMv2 response */
    result = Curl_ntlm_core_mk_ntlmv2_resp(ntlmv2hash,
                                           (unsigned char *)&entropy[0],
                                           ntlm, &ntlmv2resp, &ntresplen);
    if(result)
      return result;

    ptr_ntresp = ntlmv2resp;
  }
  else
#endif

#if USE_NTRESPONSES && USE_NTLM2SESSION
  /* We don't support NTLM2 if we don't have USE_NTRESPONSES */
  if(ntlm->flags & NTLMFLAG_NEGOTIATE_NTLM2_KEY) {
    unsigned char ntbuffer[0x18];
    unsigned char tmp[0x18];
    unsigned char md5sum[MD5_DIGEST_LENGTH];
    unsigned int entropy[2];

    /* Need to create 8 bytes random data */
    result = Curl_rand(data, &entropy[0], 2);
    if(result)
      return result;

    /* 8 bytes random data as challenge in lmresp */
    memcpy(lmresp, entropy, 8);

    /* Pad with zeros */
    memset(lmresp + 8, 0, 0x10);

    /* Fill tmp with challenge(nonce?) + entropy */
    memcpy(tmp, &ntlm->nonce[0], 8);
    memcpy(tmp + 8, entropy, 8);

    result = Curl_ssl_md5sum(tmp, 16, md5sum, MD5_DIGEST_LENGTH);
    if(!result)
      /* We shall only use the first 8 bytes of md5sum, but the des code in
         Curl_ntlm_core_lm_resp only encrypt the first 8 bytes */
      result = Curl_ntlm_core_mk_nt_hash(data, passwdp, ntbuffer);
    if(result)
      return result;

    Curl_ntlm_core_lm_resp(ntbuffer, md5sum, ntresp);

    /* End of NTLM2 Session code */

  }
  else
#endif
  {

#if USE_NTRESPONSES
    unsigned char ntbuffer[0x18];
#endif
    unsigned char lmbuffer[0x18];

#if USE_NTRESPONSES
    result = Curl_ntlm_core_mk_nt_hash(data, passwdp, ntbuffer);
    if(result)
      return result;

    Curl_ntlm_core_lm_resp(ntbuffer, &ntlm->nonce[0], ntresp);
#endif

    result = Curl_ntlm_core_mk_lm_hash(data, passwdp, lmbuffer);
    if(result)
      return result;

    Curl_ntlm_core_lm_resp(lmbuffer, &ntlm->nonce[0], lmresp);

    /* A safer but less compatible alternative is:
     *   Curl_ntlm_core_lm_resp(ntbuffer, &ntlm->nonce[0], lmresp);
     * See https://davenport.sourceforge.io/ntlm.html#ntlmVersion2 */
  }

  if(unicode) {
    domlen = domlen * 2;
    userlen = userlen * 2;
    hostlen = hostlen * 2;
  }

  lmrespoff = 64; /* size of the message header */
#if USE_NTRESPONSES
  ntrespoff = lmrespoff + 0x18;
  domoff = ntrespoff + ntresplen;
#else
  domoff = lmrespoff + 0x18;
#endif
  useroff = domoff + domlen;
  hostoff = useroff + userlen;

  /* Create the big type-3 message binary blob */
  size = snprintf((char *)ntlmbuf, NTLM_BUFSIZE,
                  NTLMSSP_SIGNATURE "%c"
                  "\x03%c%c%c"  /* 32-bit type = 3 */

                  "%c%c"  /* LanManager length */
                  "%c%c"  /* LanManager allocated space */
                  "%c%c"  /* LanManager offset */
                  "%c%c"  /* 2 zeroes */

                  "%c%c"  /* NT-response length */
                  "%c%c"  /* NT-response allocated space */
                  "%c%c"  /* NT-response offset */
                  "%c%c"  /* 2 zeroes */

                  "%c%c"  /* domain length */
                  "%c%c"  /* domain allocated space */
                  "%c%c"  /* domain name offset */
                  "%c%c"  /* 2 zeroes */

                  "%c%c"  /* user length */
                  "%c%c"  /* user allocated space */
                  "%c%c"  /* user offset */
                  "%c%c"  /* 2 zeroes */

                  "%c%c"  /* host length */
                  "%c%c"  /* host allocated space */
                  "%c%c"  /* host offset */
                  "%c%c"  /* 2 zeroes */

                  "%c%c"  /* session key length (unknown purpose) */
                  "%c%c"  /* session key allocated space (unknown purpose) */
                  "%c%c"  /* session key offset (unknown purpose) */
                  "%c%c"  /* 2 zeroes */

                  "%c%c%c%c",  /* flags */

                  /* domain string */
                  /* user string */
                  /* host string */
                  /* LanManager response */
                  /* NT response */

                  0,                /* zero termination */
                  0, 0, 0,          /* type-3 long, the 24 upper bits */

                  SHORTPAIR(0x18),  /* LanManager response length, twice */
                  SHORTPAIR(0x18),
                  SHORTPAIR(lmrespoff),
                  0x0, 0x0,

#if USE_NTRESPONSES
                  SHORTPAIR(ntresplen),  /* NT-response length, twice */
                  SHORTPAIR(ntresplen),
                  SHORTPAIR(ntrespoff),
                  0x0, 0x0,
#else
                  0x0, 0x0,
                  0x0, 0x0,
                  0x0, 0x0,
                  0x0, 0x0,
#endif
                  SHORTPAIR(domlen),
                  SHORTPAIR(domlen),
                  SHORTPAIR(domoff),
                  0x0, 0x0,

                  SHORTPAIR(userlen),
                  SHORTPAIR(userlen),
                  SHORTPAIR(useroff),
                  0x0, 0x0,

                  SHORTPAIR(hostlen),
                  SHORTPAIR(hostlen),
                  SHORTPAIR(hostoff),
                  0x0, 0x0,

                  0x0, 0x0,
                  0x0, 0x0,
                  0x0, 0x0,
                  0x0, 0x0,

                  LONGQUARTET(ntlm->flags));

  DEBUGASSERT(size == 64);
  DEBUGASSERT(size == (size_t)lmrespoff);

  /* We append the binary hashes */
  if(size < (NTLM_BUFSIZE - 0x18)) {
    memcpy(&ntlmbuf[size], lmresp, 0x18);
    size += 0x18;
  }

  DEBUG_OUT({
    fprintf(stderr, "**** TYPE3 header lmresp=");
    ntlm_print_hex(stderr, (char *)&ntlmbuf[lmrespoff], 0x18);
  });

#if USE_NTRESPONSES
  if(size < (NTLM_BUFSIZE - ntresplen)) {
    DEBUGASSERT(size == (size_t)ntrespoff);
    memcpy(&ntlmbuf[size], ptr_ntresp, ntresplen);
    size += ntresplen;
  }

  DEBUG_OUT({
    fprintf(stderr, "\n   ntresp=");
    ntlm_print_hex(stderr, (char *)&ntlmbuf[ntrespoff], ntresplen);
  });

  free(ntlmv2resp);/* Free the dynamic buffer allocated for NTLMv2 */

#endif

  DEBUG_OUT({
    fprintf(stderr, "\n   flags=0x%02.2x%02.2x%02.2x%02.2x 0x%08.8x ",
            LONGQUARTET(ntlm->flags), ntlm->flags);
    ntlm_print_flags(stderr, ntlm->flags);
    fprintf(stderr, "\n****\n");
  });

  /* Make sure that the domain, user and host strings fit in the
     buffer before we copy them there. */
  if(size + userlen + domlen + hostlen >= NTLM_BUFSIZE) {
    failf(data, "user + domain + host name too big");
    return CURLE_OUT_OF_MEMORY;
  }

  DEBUGASSERT(size == domoff);
  if(unicode)
    unicodecpy(&ntlmbuf[size], domain, domlen / 2);
  else
    memcpy(&ntlmbuf[size], domain, domlen);

  size += domlen;

  DEBUGASSERT(size == useroff);
  if(unicode)
    unicodecpy(&ntlmbuf[size], user, userlen / 2);
  else
    memcpy(&ntlmbuf[size], user, userlen);

  size += userlen;

  DEBUGASSERT(size == hostoff);
  if(unicode)
    unicodecpy(&ntlmbuf[size], host, hostlen / 2);
  else
    memcpy(&ntlmbuf[size], host, hostlen);

  size += hostlen;

  /* Convert domain, user, and host to ASCII but leave the rest as-is */
  result = Curl_convert_to_network(data, (char *)&ntlmbuf[domoff],
                                   size - domoff);
  if(result)
    return CURLE_CONV_FAILED;

  /* Return with binary blob encoded into base64 */
  result = Curl_base64_encode(NULL, (char *)ntlmbuf, size, outptr, outlen);

  Curl_auth_ntlm_cleanup(ntlm);

  return result;
}